

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O3

nifti_image * nt_read_bricks(nt_opts *opts,char *fname,int len,int *list,nifti_brick_list *NBL)

{
  int iVar1;
  nifti_image *pnVar2;
  void **ppvVar3;
  void *pvVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (((opts == (nt_opts *)0x0) || (fname == (char *)0x0)) || (NBL == (nifti_brick_list *)0x0)) {
    fprintf(_stderr,"** nt_read_bricks: bad params (%p,%p,%p)\n",opts,fname,NBL);
  }
  else {
    iVar1 = strncmp(fname,"MAKE_IM",7);
    if (iVar1 != 0) {
      if (1 < g_debug) {
        fprintf(_stderr,"-d calling nifti_image_read_bricks(%s,...)\n",fname);
      }
      pnVar2 = nifti_image_read_bricks(fname,len,list,NBL);
      return pnVar2;
    }
    if (1 < g_debug) {
      nt_read_bricks_cold_1();
    }
    pnVar2 = nifti_make_new_nim(opts->new_dim,opts->new_datatype,0);
    if (pnVar2 == (nifti_image *)0x0) {
      nt_read_bricks_cold_2();
    }
    else {
      NBL->nbricks = len;
      uVar6 = (long)pnVar2->nz * (long)pnVar2->ny * (long)pnVar2->nx * (long)pnVar2->nbyper;
      NBL->bsize = uVar6;
      ppvVar3 = (void **)calloc((long)len,8);
      NBL->bricks = ppvVar3;
      if (ppvVar3 == (void **)0x0) {
        fprintf(_stderr,"** NRB: failed to alloc %d pointers\n",(ulong)(uint)len);
      }
      else {
        if (1 < g_debug) {
          fprintf(_stderr,"+d NRB, allocating %d bricks of %u bytes...\n",(ulong)(uint)len,
                  uVar6 & 0xffffffff);
        }
        if (len < 1) {
          return pnVar2;
        }
        uVar6 = NBL->bsize;
        ppvVar3 = NBL->bricks;
        uVar5 = 0;
        while( true ) {
          pvVar4 = calloc(1,uVar6);
          ppvVar3[uVar5] = pvVar4;
          ppvVar3 = NBL->bricks;
          if (ppvVar3[uVar5] == (void *)0x0) break;
          uVar5 = uVar5 + 1;
          if ((uint)len == uVar5) {
            return pnVar2;
          }
        }
        fprintf(_stderr,"** NRB: failed to alloc brick %d of %u bytes\n",uVar5 & 0xffffffff,
                uVar6 & 0xffffffff);
        nifti_free_NBL(NBL);
      }
      nifti_image_free(pnVar2);
    }
  }
  return (nifti_image *)0x0;
}

Assistant:

nifti_image * nt_read_bricks(nt_opts * opts, char * fname, int len, int * list,
                             nifti_brick_list * NBL)
{
    nifti_image * nim;
    int           c;

    /* swapped is not necessary */
    if( !opts || !fname || !NBL ) {
        fprintf(stderr,"** nt_read_bricks: bad params (%p,%p,%p)\n",
                (void *)opts, (void *)fname, (void *)NBL);
        return NULL;
    }

    /* if the user does not want an empty image, do normal read_bricks */
    if( strncmp(fname,NT_MAKE_IM_NAME,strlen(NT_MAKE_IM_NAME)) ) {
        if(g_debug > 1)
           fprintf(stderr,"-d calling nifti_image_read_bricks(%s,...)\n",fname);
        return nifti_image_read_bricks(fname, len, list, NBL);
    }

    /* so generate an emtpy image */
    if(g_debug > 1) {
        fprintf(stderr,"+d NT_RB: generating EMPTY IMAGE from %s...\n",fname);
        if(g_debug > 2) {
            printf("   new_dim[8] = ");
            disp_raw_data(opts->new_dim, DT_INT32, 8, ' ', 1);
            printf("   new_datatype = %d\n", opts->new_datatype);
            if( list && len > 0 ) {
                printf("   brick_list[%d] = ", len);
                disp_raw_data(list, DT_INT32, len, ' ', 1);
            }
            fflush(stdout);  /* disp_raw_data uses stdout */
        }
    }

    /* first, get nim struct without data */
    nim = nifti_make_new_nim(opts->new_dim, opts->new_datatype, 0);
    if( !nim ) {
        fprintf(stderr,"** nt_read_bricks, nifti_make_new_nim failure\n");
        return NULL;
    }

    /* now populate NBL (can be based only on len and nim) */
    NBL->nbricks = len;
    NBL->bsize = (size_t)nim->nbyper * nim->nx * nim->ny * nim->nz;
    NBL->bricks = (void **)calloc(NBL->nbricks, sizeof(void *));
    if( !NBL->bricks ){
        fprintf(stderr,"** NRB: failed to alloc %d pointers\n",NBL->nbricks);
        nifti_image_free(nim);
        return NULL;
    }

    if(g_debug > 1)
        fprintf(stderr,"+d NRB, allocating %d bricks of %u bytes...\n",
                NBL->nbricks, (unsigned)NBL->bsize);

    /* now allocate the data pointers */
    for( c = 0; c < len; c++ ) {
        NBL->bricks[c] = calloc(1, NBL->bsize);
        if( !NBL->bricks[c] ){
            fprintf(stderr,"** NRB: failed to alloc brick %d of %u bytes\n",
                    c, (unsigned)NBL->bsize);
            nifti_free_NBL(NBL); nifti_image_free(nim); return NULL;
        }
    }

    return nim;
}